

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* filesystem::path::tokenize
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *string,string *delim)

{
  long lVar1;
  long lVar2;
  value_type local_58 [39];
  undefined1 local_31;
  size_type local_30;
  size_type pos;
  size_type lastPos;
  string *delim_local;
  string *string_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  pos = 0;
  lastPos = (size_type)delim;
  delim_local = string;
  string_local = (string *)__return_storage_ptr__;
  local_30 = std::__cxx11::string::find_first_of((string *)string,(ulong)delim);
  local_31 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    if (pos == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    if (local_30 != pos) {
      std::__cxx11::string::substr((ulong)local_58,(ulong)delim_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
    }
    pos = local_30;
    if (local_30 == 0xffffffffffffffff) break;
    lVar1 = local_30 + 1;
    lVar2 = std::__cxx11::string::length();
    if (lVar1 == lVar2) {
      return __return_storage_ptr__;
    }
    pos = pos + 1;
    local_30 = std::__cxx11::string::find_first_of((string *)delim_local,lastPos);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> tokenize(const std::string &string, const std::string &delim) {
        std::string::size_type lastPos = 0, pos = string.find_first_of(delim, lastPos);
        std::vector<std::string> tokens;

        while (lastPos != std::string::npos) {
            if (pos != lastPos)
                tokens.push_back(string.substr(lastPos, pos - lastPos));
            lastPos = pos;
            if (lastPos == std::string::npos || lastPos + 1 == string.length())
                break;
            pos = string.find_first_of(delim, ++lastPos);
        }

        return tokens;
    }